

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferVkImpl::InvalidateMappedRange(BufferVkImpl *this,Uint64 StartOffset,Uint64 Size)

{
  RenderDeviceVkImpl *pRVar1;
  VulkanLogicalDevice *this_00;
  VulkanPhysicalDevice *this_01;
  VkPhysicalDeviceProperties *pVVar2;
  type tVar3;
  undefined1 local_58 [8];
  VkMappedMemoryRange MappedRange;
  VkPhysicalDeviceLimits *DeviceLimits;
  VulkanLogicalDevice *LogicalDevice;
  Uint64 Size_local;
  Uint64 StartOffset_local;
  BufferVkImpl *this_local;
  
  BufferBase<Diligent::EngineVkImplTraits>::DvpVerifyInvalidateMappedRangeArguments
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,StartOffset,Size);
  pRVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRVar1);
  pRVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar1);
  pVVar2 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_01);
  MappedRange.size = (VkDeviceSize)&pVVar2->limits;
  memset(local_58,0,0x28);
  local_58._0_4_ = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  MappedRange.pNext =
       VulkanUtilities::VulkanMemoryPage::GetVkMemory((this->m_MemoryAllocation).Page);
  MappedRange.memory =
       (VkDeviceMemory)
       AlignDown<unsigned_long,unsigned_long>
                 (this->m_BufferMemoryAlignedOffset + StartOffset,
                  *(unsigned_long *)(MappedRange.size + 0x1f0));
  tVar3 = AlignUp<unsigned_long,unsigned_long>
                    (this->m_BufferMemoryAlignedOffset + StartOffset + Size,
                     *(unsigned_long *)(MappedRange.size + 0x1f0));
  MappedRange.offset = tVar3 - (long)MappedRange.memory;
  VulkanUtilities::VulkanLogicalDevice::InvalidateMappedMemoryRanges
            (this_00,1,(VkMappedMemoryRange *)local_58);
  return;
}

Assistant:

void BufferVkImpl::InvalidateMappedRange(Uint64 StartOffset, Uint64 Size)
{
    DvpVerifyInvalidateMappedRangeArguments(StartOffset, Size);

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    const VkPhysicalDeviceLimits&               DeviceLimits  = GetDevice()->GetPhysicalDevice().GetProperties().limits;

    VkMappedMemoryRange MappedRange{};
    MappedRange.sType  = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
    MappedRange.memory = m_MemoryAllocation.Page->GetVkMemory();
    MappedRange.offset = AlignDown(m_BufferMemoryAlignedOffset + StartOffset, DeviceLimits.nonCoherentAtomSize);
    MappedRange.size   = AlignUp(m_BufferMemoryAlignedOffset + StartOffset + Size, DeviceLimits.nonCoherentAtomSize) - MappedRange.offset;
    LogicalDevice.InvalidateMappedMemoryRanges(1, &MappedRange);
}